

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O3

Mzp * patch_string_table(Mzp *__return_storage_ptr__,json *translation_db,Mzp *mzp_archive)

{
  pointer pMVar1;
  pointer pMVar2;
  pointer pcVar3;
  code *pcVar4;
  pointer pbVar5;
  pointer pbVar6;
  const_reference pvVar7;
  iterator iVar8;
  const_reference pvVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 data [8];
  pointer pbVar13;
  undefined1 local_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  long local_120 [2];
  json *local_110;
  Mzp *local_108;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  original_strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translated_strings;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ulong local_b0;
  undefined1 local_a8 [8];
  string new_text_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> new_text_offsets;
  uint local_54;
  undefined1 auStack_50 [4];
  uint32_t text_write_offset;
  string serialized_new_offsets;
  
  pMVar1 = (mzp_archive->entry_headers).
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (mzp_archive->entry_headers).
           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = (long)pMVar2 - (long)pMVar1;
  local_110 = translation_db;
  if ((long)uVar11 >> 3 !=
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  if ((uVar11 & 8) != 0) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entry_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entry_headers).
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pMVar2 != pMVar1) {
    local_b0 = 0;
    local_108 = mzp_archive;
    do {
      parse_offset_table((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,
                         (mzp_archive->entry_data).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_b0);
      uVar11 = local_b0;
      uVar12 = (uint)local_b0 | 1;
      extract_string_table
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,
                 (mzp_archive->entry_data).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
      fprintf(_stderr,"Loaded %lu strings from tables %u+%u\n",
              (long)original_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_100 >> 5,
              uVar11 & 0xffffffff,(ulong)uVar12);
      pbVar6 = original_strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      original_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      translated_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      translated_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pbVar13 = original_strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar5 = translated_strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      mzp_archive = local_108;
      for (data = local_100; local_108 = mzp_archive,
          original_strings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar13,
          translated_strings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar5, data != (undefined1  [8])pbVar6;
          data = (undefined1  [8])((long)data + 0x20)) {
        mg::util::sha256((string *)auStack_50,(string *)data);
        mg::string::bytes_to_hex((string *)local_a8,(string *)auStack_50);
        if ((size_type *)_auStack_50 != &serialized_new_offsets._M_string_length) {
          operator_delete(_auStack_50,
                          CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                   (undefined1)serialized_new_offsets._M_string_length) + 1);
        }
        _auStack_50 = (pointer)&serialized_new_offsets._M_string_length;
        pcVar3 = (((string *)data)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_50,pcVar3,pcVar3 + ((string *)data)->_M_string_length);
        pvVar7 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_110,"script_text_by_hash");
        if ((((pvVar7->m_type == object) &&
             (iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::find(&((pvVar7->m_value).object)->_M_t,(key_type *)local_a8),
             (_Rb_tree_header *)iVar8._M_node !=
             &(((pvVar7->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) &&
            (pvVar9 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](pvVar7,(key_type *)local_a8), pvVar9->m_type == object)) &&
           (iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ::find(&((pvVar9->m_value).object)->_M_t,&TARGET_LANGUAGE_abi_cxx11_),
           (_Rb_tree_header *)iVar8._M_node !=
           &(((pvVar9->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar7,(key_type *)local_a8);
          pvVar7 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar7,&TARGET_LANGUAGE_abi_cxx11_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((undefined1 *)((long)&new_text_data.field_2 + 8),pvVar7);
          if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            std::__cxx11::string::_M_assign((string *)auStack_50);
          }
          if ((pointer *)new_text_data.field_2._8_8_ !=
              &new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
            operator_delete((void *)new_text_data.field_2._8_8_,
                            (long)new_text_offsets.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &original_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_50);
        if ((size_type *)_auStack_50 != &serialized_new_offsets._M_string_length) {
          operator_delete(_auStack_50,
                          CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                   (undefined1)serialized_new_offsets._M_string_length) + 1);
        }
        if (local_a8 != (undefined1  [8])&new_text_data._M_string_length) {
          operator_delete((void *)local_a8,
                          CONCAT71(new_text_data._M_string_length._1_7_,
                                   (undefined1)new_text_data._M_string_length) + 1);
        }
        pbVar13 = original_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar5 = translated_strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        mzp_archive = local_108;
      }
      new_text_data.field_2._8_8_ = 0;
      new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8 = (undefined1  [8])&new_text_data._M_string_length;
      new_text_data._M_dataplus._M_p = (pointer)0x0;
      new_text_data._M_string_length._0_1_ = 0;
      local_54 = 0;
      if (pbVar13 == pbVar5) {
        _auStack_50 = (pointer)0x0;
LAB_0010df83:
        new_text_data._M_dataplus._M_p = _auStack_50;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&new_text_data.field_2 + 8),
                   (iterator)
                   new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)auStack_50);
      }
      else {
        do {
          _auStack_50 = (pointer)&serialized_new_offsets._M_string_length;
          pcVar3 = (pbVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)auStack_50,pcVar3,pcVar3 + pbVar13->_M_string_length);
          std::__cxx11::string::append((char *)auStack_50);
          std::__cxx11::string::resize
                    ((ulong)local_a8,
                     (char)serialized_new_offsets._M_dataplus._M_p +
                     (char)new_text_data._M_dataplus._M_p);
          memcpy((pointer)((long)local_a8 + (ulong)local_54),_auStack_50,
                 (size_t)serialized_new_offsets._M_dataplus._M_p);
          if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                       (new_text_data.field_2._M_local_buf + 8),
                       (iterator)
                       new_text_offsets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_54);
          }
          else {
            *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start = local_54;
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start =
                 new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          local_54 = local_54 + (int)serialized_new_offsets._M_dataplus._M_p;
          if ((size_type *)_auStack_50 != &serialized_new_offsets._M_string_length) {
            operator_delete(_auStack_50,
                            CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                     (undefined1)serialized_new_offsets._M_string_length) + 1);
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar5);
        _auStack_50 = new_text_data._M_dataplus._M_p;
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) goto LAB_0010df83;
        *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = (uint)new_text_data._M_dataplus._M_p;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      _auStack_50 = new_text_data._M_dataplus._M_p;
      if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&new_text_data.field_2 + 8),
                   (iterator)
                   new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)auStack_50);
      }
      else {
        *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = (uint)new_text_data._M_dataplus._M_p;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      auStack_50 = (undefined1  [4])0xffffffff;
      if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&new_text_data.field_2 + 8),
                   (iterator)
                   new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(uint *)auStack_50);
      }
      else {
        *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = 0xffffffff;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      auStack_50 = (undefined1  [4])0xffffffff;
      if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&new_text_data.field_2 + 8),
                   (iterator)
                   new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(uint *)auStack_50);
      }
      else {
        *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = 0xffffffff;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      auStack_50 = (undefined1  [4])0xffffffff;
      if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&new_text_data.field_2 + 8),
                   (iterator)
                   new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,(uint *)auStack_50);
      }
      else {
        *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = 0xffffffff;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      _auStack_50 = (pointer)&serialized_new_offsets._M_string_length;
      serialized_new_offsets._M_dataplus._M_p = (pointer)0x0;
      serialized_new_offsets._M_string_length._0_1_ = 0;
      std::__cxx11::string::resize
                ((ulong)auStack_50,
                 (char)new_text_offsets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start - (char)new_text_data.field_2._8_8_);
      if ((pointer)new_text_data.field_2._8_8_ !=
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        uVar10 = new_text_data.field_2._8_8_;
        do {
          uVar12 = *(uint *)uVar10;
          *(uint *)(_auStack_50 + (uVar11 & 0xffffffff)) =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          uVar11 = (uVar11 & 0xffffffff) + 4;
          uVar10 = uVar10 + 4;
        } while ((pointer)uVar10 !=
                 new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      translated_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &translated_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,_auStack_50,
                 serialized_new_offsets._M_dataplus._M_p + _auStack_50);
      mg::data::Mzp::add_entry
                (__return_storage_ptr__,
                 (string *)
                 &translated_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)translated_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_c0) {
        operator_delete(translated_strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        local_c0._M_allocated_capacity + 1);
      }
      offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_a8,
                 new_text_data._M_dataplus._M_p + (long)local_a8);
      mg::data::Mzp::add_entry
                (__return_storage_ptr__,
                 (string *)
                 &offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)local_120) {
        operator_delete(offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_120[0] + 1);
      }
      if ((size_type *)_auStack_50 != &serialized_new_offsets._M_string_length) {
        operator_delete(_auStack_50,
                        CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                 (undefined1)serialized_new_offsets._M_string_length) + 1);
      }
      if (local_a8 != (undefined1  [8])&new_text_data._M_string_length) {
        operator_delete((void *)local_a8,
                        CONCAT71(new_text_data._M_string_length._1_7_,
                                 (undefined1)new_text_data._M_string_length) + 1);
      }
      if (new_text_data.field_2._8_8_ != 0) {
        operator_delete((void *)new_text_data.field_2._8_8_,
                        (long)new_text_offsets.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        new_text_data.field_2._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&original_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (local_148 != (undefined1  [8])0x0) {
        operator_delete((void *)local_148,
                        (long)offsets.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_148);
      }
      local_b0 = (ulong)((int)local_b0 + 2);
    } while (local_b0 <
             (ulong)((long)(mzp_archive->entry_headers).
                           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mzp_archive->entry_headers).
                           super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

mg::data::Mzp patch_string_table(const nlohmann::json &translation_db,
                                 const mg::data::Mzp mzp_archive) {
  // The MZP archive consists of N pairs of string offset table + string data
  // table. For each pair, iterate the string table, extract the string, hash
  // it, check if the translated string exists, and if so inject the translated
  // string instead.
  ASSERT(mzp_archive.entry_headers.size() == mzp_archive.entry_data.size());
  ASSERT(mzp_archive.entry_headers.size() % 2 == 0);

  // Return MZP
  mg::data::Mzp ret;

  for (unsigned i = 0; i < mzp_archive.entry_headers.size(); i += 2) {
    const unsigned offset_table_idx = i;
    const unsigned string_table_idx = i + 1;

    // Extract original strings
    const std::vector<uint32_t> offsets =
        parse_offset_table(mzp_archive.entry_data[offset_table_idx]);
    const std::vector<std::string> original_strings =
        extract_string_table(mzp_archive.entry_data[string_table_idx], offsets);
    fprintf(stderr, "Loaded %lu strings from tables %u+%u\n",
            original_strings.size(), offset_table_idx, string_table_idx);

    // Iterate the strings, and replace any translated ones with the appropriate
    // text
    std::vector<std::string> translated_strings;
    for (auto &line : original_strings) {
      // Hash the line
      const std::string line_digest_hex =
          mg::string::bytes_to_hex(mg::util::sha256(line));

      // If we find nothing, fall back to the original text
      std::string line_to_insert = line;

      // Is this hash in our TL DB?
      auto &script_text_by_hash = translation_db["script_text_by_hash"];
      if (script_text_by_hash.contains(line_digest_hex)) {
        if (script_text_by_hash[line_digest_hex].contains(TARGET_LANGUAGE)) {
          const std::string translated_line =
              script_text_by_hash[line_digest_hex][TARGET_LANGUAGE];
          if (translated_line.size() > 0) {
            // We have a translation
            line_to_insert = translated_line;
          }
        }
      }

      // Append the line to our output vector
      translated_strings.emplace_back(line_to_insert);
    }

    // Now that we have a vector of translated strings, we need to insert them
    // back into the MZP and update the offset table.
    // Note that during reinsertion, we re-add the \r\n escape sequence at the
    // end of each line
    std::vector<uint32_t> new_text_offsets;
    std::string new_text_data;
    uint32_t text_write_offset = 0;
    for (auto &line : translated_strings) {
      // Append \r\n
      const std::string padded_line = line + "\r\n";

      // Append this string to our buffer
      new_text_data.resize(new_text_data.size() + padded_line.size());
      memcpy(&new_text_data[text_write_offset], padded_line.data(),
             padded_line.size());

      // Add that offset for this string to the offset table
      new_text_offsets.emplace_back(text_write_offset);

      // Increment the write pointer by the size of the string
      text_write_offset += padded_line.size();
    }

    // For some reason, the offsets seem to include 2 instances of offsets that
    // point to the final byte of the string table. Recreate them here in case
    // the game actually needs this info.
    new_text_offsets.emplace_back(new_text_data.size());
    new_text_offsets.emplace_back(new_text_data.size());

    // The offset table ends with 12 bytes of 0xFF
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);

    // Now that we have the new string data, and the new list of offsets, pack
    // the list of offsets back into a byte array
    std::string serialized_new_offsets;
    serialized_new_offsets.resize(new_text_offsets.size() * sizeof(uint32_t));
    uint32_t offset_write_offset = 0;
    for (uint32_t offset : new_text_offsets) {
      const uint32_t be_offset = mg::host_to_be_u32(offset);
      memcpy(&serialized_new_offsets[offset_write_offset], &be_offset,
             sizeof(be_offset));
      offset_write_offset += sizeof(uint32_t);
    }

    // Add the new segments to our output MZP
    ret.add_entry(serialized_new_offsets);
    ret.add_entry(new_text_data);
  }

  return ret;
}